

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_7zip.c
# Opt level: O0

int make_header(archive_write *a,uint64_t offset,uint64_t pack_size,uint64_t unpack_size,
               int codernum,coder *coders)

{
  la_zaction run;
  int iVar1;
  ssize_t sVar2;
  coder *in_RDX;
  undefined8 in_RSI;
  uint64_t in_RDI;
  archive_write *in_R9;
  uint64_t unaff_retaddr;
  archive_write *in_stack_00000008;
  uint32_t attr;
  uint32_t encattr;
  uint8_t mask;
  uint8_t b;
  int r;
  file *file;
  _7zip *zip;
  uint in_stack_ffffffffffffffa8;
  uint uVar3;
  undefined4 in_stack_ffffffffffffffac;
  undefined2 in_stack_ffffffffffffffb0;
  byte in_stack_ffffffffffffffb2;
  byte in_stack_ffffffffffffffb3;
  undefined4 in_stack_ffffffffffffffb4;
  size_t sVar4;
  void *buff;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar1 = (int)((ulong)in_RSI >> 0x20);
  buff = *(void **)(in_RDI + 0xd0);
  run = enc_uint64((archive_write *)
                   CONCAT44(in_stack_ffffffffffffffb4,
                            CONCAT13(in_stack_ffffffffffffffb3,
                                     CONCAT12(in_stack_ffffffffffffffb2,in_stack_ffffffffffffffb0)))
                   ,CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  if (((-1 < (int)run) &&
      (((*(long *)((long)buff + 0x20) == 0 ||
        ((run = enc_uint64((archive_write *)
                           CONCAT44(run,CONCAT13(in_stack_ffffffffffffffb3,
                                                 CONCAT12(in_stack_ffffffffffffffb2,
                                                          in_stack_ffffffffffffffb0))),
                           CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)),
         -1 < (int)run &&
         (run = make_streamsInfo(in_stack_00000008,unaff_retaddr,
                                 CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                                 in_RDI,iVar1,in_RDX,(int)file,(uint32_t)zip), -1 < (int)run)))) &&
       (run = enc_uint64((archive_write *)
                         CONCAT44(run,CONCAT13(in_stack_ffffffffffffffb3,
                                               CONCAT12(in_stack_ffffffffffffffb2,
                                                        in_stack_ffffffffffffffb0))),
                         CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)),
       -1 < (int)run)))) &&
     (run = enc_uint64((archive_write *)
                       CONCAT44(run,CONCAT13(in_stack_ffffffffffffffb3,
                                             CONCAT12(in_stack_ffffffffffffffb2,
                                                      in_stack_ffffffffffffffb0))),
                       CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)), -1 < (int)run
     )) {
    if (*(long *)((long)buff + 0x28) != 0) {
      iVar1 = enc_uint64((archive_write *)
                         CONCAT44(run,CONCAT13(in_stack_ffffffffffffffb3,
                                               CONCAT12(in_stack_ffffffffffffffb2,
                                                        in_stack_ffffffffffffffb0))),
                         CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      if (iVar1 < 0) {
        return iVar1;
      }
      run = enc_uint64((archive_write *)
                       CONCAT44(iVar1,CONCAT13(in_stack_ffffffffffffffb3,
                                               CONCAT12(in_stack_ffffffffffffffb2,
                                                        in_stack_ffffffffffffffb0))),
                       CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      if ((int)run < 0) {
        return run;
      }
      in_stack_ffffffffffffffb3 = 0;
      in_stack_ffffffffffffffb2 = 0x80;
      for (sVar4 = *(size_t *)((long)buff + 0xf110); sVar4 != 0; sVar4 = *(size_t *)(sVar4 + 0x18))
      {
        if (*(long *)(sVar4 + 0x30) == 0) {
          in_stack_ffffffffffffffb3 = in_stack_ffffffffffffffb3 | in_stack_ffffffffffffffb2;
        }
        in_stack_ffffffffffffffb2 = (byte)((int)(uint)in_stack_ffffffffffffffb2 >> 1);
        if (in_stack_ffffffffffffffb2 == 0) {
          sVar2 = compress_out(in_R9,buff,sVar4,run);
          run = (la_zaction)sVar2;
          if ((int)run < 0) {
            return run;
          }
          in_stack_ffffffffffffffb2 = 0x80;
          in_stack_ffffffffffffffb3 = 0;
        }
      }
      if (in_stack_ffffffffffffffb2 != 0x80) {
        sVar2 = compress_out(in_R9,buff,0,run);
        run = (la_zaction)sVar2;
        if ((int)run < 0) {
          return run;
        }
      }
    }
    if (*(ulong *)((long)buff + 0x30) < *(ulong *)((long)buff + 0x28)) {
      iVar1 = enc_uint64((archive_write *)
                         CONCAT44(run,CONCAT13(in_stack_ffffffffffffffb3,
                                               CONCAT12(in_stack_ffffffffffffffb2,
                                                        in_stack_ffffffffffffffb0))),
                         CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      if (iVar1 < 0) {
        return iVar1;
      }
      run = enc_uint64((archive_write *)
                       CONCAT44(iVar1,CONCAT13(in_stack_ffffffffffffffb3,
                                               CONCAT12(in_stack_ffffffffffffffb2,
                                                        in_stack_ffffffffffffffb0))),
                       CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      if ((int)run < 0) {
        return run;
      }
      in_stack_ffffffffffffffb3 = 0;
      in_stack_ffffffffffffffb2 = 0x80;
      for (sVar4 = *(size_t *)((long)buff + 0xf110); sVar4 != 0; sVar4 = *(size_t *)(sVar4 + 0x18))
      {
        if (*(long *)(sVar4 + 0x30) == 0) {
          if (-1 < (char)(*(char *)(sVar4 + 0x78) << 7)) {
            in_stack_ffffffffffffffb3 = in_stack_ffffffffffffffb3 | in_stack_ffffffffffffffb2;
          }
          in_stack_ffffffffffffffb2 = (byte)((int)(uint)in_stack_ffffffffffffffb2 >> 1);
          if (in_stack_ffffffffffffffb2 == 0) {
            sVar2 = compress_out(in_R9,buff,sVar4,run);
            run = (la_zaction)sVar2;
            if ((int)run < 0) {
              return run;
            }
            in_stack_ffffffffffffffb2 = 0x80;
            in_stack_ffffffffffffffb3 = 0;
          }
        }
      }
      if (in_stack_ffffffffffffffb2 != 0x80) {
        sVar2 = compress_out(in_R9,buff,0,run);
        run = (la_zaction)sVar2;
        if ((int)run < 0) {
          return run;
        }
      }
    }
    run = enc_uint64((archive_write *)
                     CONCAT44(run,CONCAT13(in_stack_ffffffffffffffb3,
                                           CONCAT12(in_stack_ffffffffffffffb2,
                                                    in_stack_ffffffffffffffb0))),
                     CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    if (((-1 < (int)run) &&
        (run = enc_uint64((archive_write *)
                          CONCAT44(run,CONCAT13(in_stack_ffffffffffffffb3,
                                                CONCAT12(in_stack_ffffffffffffffb2,
                                                         in_stack_ffffffffffffffb0))),
                          CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)),
        -1 < (int)run)) &&
       (run = enc_uint64((archive_write *)
                         CONCAT44(run,CONCAT13(in_stack_ffffffffffffffb3,
                                               CONCAT12(in_stack_ffffffffffffffb2,
                                                        in_stack_ffffffffffffffb0))),
                         CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)),
       -1 < (int)run)) {
      for (sVar4 = *(size_t *)((long)buff + 0xf110); sVar4 != 0; sVar4 = *(size_t *)(sVar4 + 0x18))
      {
        sVar2 = compress_out(in_R9,buff,sVar4,run);
        run = (la_zaction)sVar2;
        if ((int)run < 0) {
          return run;
        }
      }
      run = make_time(in_R9,(uint8_t)((ulong)buff >> 0x38),(uint)buff,0);
      iVar1 = (int)(sVar4 >> 0x20);
      if ((((-1 < (int)run) &&
           (run = make_time(in_R9,(uint8_t)((ulong)buff >> 0x38),(uint)buff,iVar1), -1 < (int)run))
          && ((run = make_time(in_R9,(uint8_t)((ulong)buff >> 0x38),(uint)buff,iVar1), -1 < (int)run
              && ((run = enc_uint64((archive_write *)
                                    CONCAT44(run,CONCAT13(in_stack_ffffffffffffffb3,
                                                          CONCAT12(in_stack_ffffffffffffffb2,
                                                                   in_stack_ffffffffffffffb0))),
                                    CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)),
                  -1 < (int)run &&
                  (run = enc_uint64((archive_write *)
                                    CONCAT44(run,CONCAT13(in_stack_ffffffffffffffb3,
                                                          CONCAT12(in_stack_ffffffffffffffb2,
                                                                   in_stack_ffffffffffffffb0))),
                                    CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)),
                  -1 < (int)run)))))) &&
         ((run = enc_uint64((archive_write *)
                            CONCAT44(run,CONCAT13(in_stack_ffffffffffffffb3,
                                                  CONCAT12(in_stack_ffffffffffffffb2,
                                                           in_stack_ffffffffffffffb0))),
                            CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)),
          -1 < (int)run &&
          (run = enc_uint64((archive_write *)
                            CONCAT44(run,CONCAT13(in_stack_ffffffffffffffb3,
                                                  CONCAT12(in_stack_ffffffffffffffb2,
                                                           in_stack_ffffffffffffffb0))),
                            CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)),
          -1 < (int)run)))) {
        for (sVar4 = *(size_t *)((long)buff + 0xf110); sVar4 != 0; sVar4 = *(size_t *)(sVar4 + 0x18)
            ) {
          if ((char)(*(char *)(sVar4 + 0x78) << 7) < '\0') {
            uVar3 = 0x8010;
          }
          else {
            uVar3 = 0x8020;
          }
          if ((*(uint *)(sVar4 + 0x70) & 0x92) == 0) {
            uVar3 = uVar3 | 1;
          }
          in_stack_ffffffffffffffa8 = *(int *)(sVar4 + 0x70) << 0x10 | uVar3;
          archive_le32enc(&stack0xffffffffffffffac,in_stack_ffffffffffffffa8);
          sVar2 = compress_out(in_R9,buff,sVar4,run);
          run = (la_zaction)sVar2;
          if ((int)run < 0) {
            return run;
          }
        }
        run = enc_uint64((archive_write *)
                         CONCAT44(run,CONCAT13(in_stack_ffffffffffffffb3,
                                               CONCAT12(in_stack_ffffffffffffffb2,
                                                        in_stack_ffffffffffffffb0))),
                         CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
        if ((-1 < (int)run) &&
           (run = enc_uint64((archive_write *)
                             CONCAT44(run,CONCAT13(in_stack_ffffffffffffffb3,
                                                   CONCAT12(in_stack_ffffffffffffffb2,
                                                            in_stack_ffffffffffffffb0))),
                             CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)),
           -1 < (int)run)) {
          run = ARCHIVE_Z_FINISH;
        }
      }
    }
  }
  return run;
}

Assistant:

static int
make_header(struct archive_write *a, uint64_t offset, uint64_t pack_size,
    uint64_t unpack_size, int codernum, struct coder *coders)
{
	struct _7zip *zip = (struct _7zip *)a->format_data;
	struct file *file;
	int r;
	uint8_t b, mask;

	/*
	 * Make FilesInfo.
	 */
	r = enc_uint64(a, kHeader);
	if (r < 0)
		return (r);

	/*
	 * If there are empty files only, do not write MainStreamInfo.
	 */
	if (zip->total_number_nonempty_entry) {
		/*
		 * Make MainStreamInfo.
		 */
		r = enc_uint64(a, kMainStreamsInfo);
		if (r < 0)
			return (r);
		r = make_streamsInfo(a, offset, pack_size, unpack_size,
		      codernum, coders, 1, 0);
		if (r < 0)
			return (r);
	}

	/*
	 * Make FilesInfo.
	 */
	r = enc_uint64(a, kFilesInfo);
	if (r < 0)
		return (r);

	/* Write numFiles. */
	r = enc_uint64(a, zip->total_number_entry);
	if (r < 0)
		return (r);

	if (zip->total_number_empty_entry > 0) {
		/* Make EmptyStream. */
		r = enc_uint64(a, kEmptyStream);
		if (r < 0)
			return (r);

		/* Write EmptyStream Size. */
		r = enc_uint64(a, (zip->total_number_entry+7)>>3);
		if (r < 0)
			return (r);

		b = 0;
		mask = 0x80;
		file = zip->file_list.first;
		for (;file != NULL; file = file->next) {
			if (file->size == 0)
				b |= mask;
			mask >>= 1;
			if (mask == 0) {
				r = (int)compress_out(a, &b, 1, ARCHIVE_Z_RUN);
				if (r < 0)
					return (r);
				mask = 0x80;
				b = 0;
			}
		}
		if (mask != 0x80) {
			r = (int)compress_out(a, &b, 1, ARCHIVE_Z_RUN);
			if (r < 0)
				return (r);
		}
	}

	if (zip->total_number_empty_entry > zip->total_number_dir_entry) {
		/* Make EmptyFile. */
		r = enc_uint64(a, kEmptyFile);
		if (r < 0)
			return (r);

		/* Write EmptyFile Size. */
		r = enc_uint64(a, (zip->total_number_empty_entry + 7) >> 3);
		if (r < 0)
			return (r);

		b = 0;
		mask = 0x80;
		file = zip->file_list.first;
		for (;file != NULL; file = file->next) {
			if (file->size)
				continue;
			if (!file->dir)
				b |= mask;
			mask >>= 1;
			if (mask == 0) {
				r = (int)compress_out(a, &b, 1, ARCHIVE_Z_RUN);
				if (r < 0)
					return (r);
				mask = 0x80;
				b = 0;
			}
		}
		if (mask != 0x80) {
			r = (int)compress_out(a, &b, 1, ARCHIVE_Z_RUN);
			if (r < 0)
				return (r);
		}
	}

	/* Make Name. */
	r = enc_uint64(a, kName);
	if (r < 0)
		return (r);

	/* Write Nume size. */
	r = enc_uint64(a, zip->total_bytes_entry_name+1);
	if (r < 0)
		return (r);

	/* Write dmy byte. */
	r = enc_uint64(a, 0);
	if (r < 0)
		return (r);

	file = zip->file_list.first;
	for (;file != NULL; file = file->next) {
		r = (int)compress_out(a, file->utf16name, file->name_len+2,
			ARCHIVE_Z_RUN);
		if (r < 0)
			return (r);
	}

	/* Make MTime. */
	r = make_time(a, kMTime, MTIME_IS_SET, MTIME);
	if (r < 0)
		return (r);

	/* Make CTime. */
	r = make_time(a, kCTime, CTIME_IS_SET, CTIME);
	if (r < 0)
		return (r);

	/* Make ATime. */
	r = make_time(a, kATime, ATIME_IS_SET, ATIME);
	if (r < 0)
		return (r);

	/* Make Attributes. */
	r = enc_uint64(a, kAttributes);
	if (r < 0)
		return (r);

	/* Write Attributes size. */
	r = enc_uint64(a, 2 + zip->total_number_entry * 4);
	if (r < 0)
		return (r);

	/* Write "All Are Defined". */
	r = enc_uint64(a, 1);
	if (r < 0)
		return (r);

	/* Write dmy byte. */
	r = enc_uint64(a, 0);
	if (r < 0)
		return (r);

	file = zip->file_list.first;
	for (;file != NULL; file = file->next) {
		/*
		 * High 16bits is unix mode.
		 * Low 16bits is Windows attributes.
		 */
		uint32_t encattr, attr;
		if (file->dir)
			attr = 0x8010;
		else
			attr = 0x8020;
		if ((file->mode & 0222) == 0)
			attr |= 1;/* Read Only. */
		attr |= ((uint32_t)file->mode) << 16;
		archive_le32enc(&encattr, attr);
		r = (int)compress_out(a, &encattr, 4, ARCHIVE_Z_RUN);
		if (r < 0)
			return (r);
	}

	/* Write End. */
	r = enc_uint64(a, kEnd);
	if (r < 0)
		return (r);

	/* Write End. */
	r = enc_uint64(a, kEnd);
	if (r < 0)
		return (r);

	return (ARCHIVE_OK);
}